

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

vector<sfc::Image,_std::allocator<sfc::Image>_> * __thiscall
sfc::Image::crops(vector<sfc::Image,_std::allocator<sfc::Image>_> *__return_storage_ptr__,
                 Image *this,uint tile_width,uint tile_height,Mode mode)

{
  uint uVar1;
  uint uVar2;
  uint y;
  bool bVar3;
  Image local_b8;
  
  (__return_storage_ptr__->super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = this->_height;
  if (uVar2 != 0) {
    uVar1 = this->_width;
    y = 0;
    do {
      bVar3 = uVar1 != 0;
      uVar1 = 0;
      if (bVar3) {
        uVar2 = 0;
        do {
          crop(&local_b8,this,uVar2,y,tile_width,tile_height,mode);
          std::vector<sfc::Image,_std::allocator<sfc::Image>_>::emplace_back<sfc::Image>
                    (__return_storage_ptr__,&local_b8);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_b8._colors._M_t);
          if (local_b8._palette.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8._palette.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_b8._palette.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b8._palette.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_b8._indexed_data.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8._indexed_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_b8._indexed_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b8._indexed_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_b8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8._data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_b8._data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b8._data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar2 = uVar2 + tile_width;
          uVar1 = this->_width;
        } while (uVar2 < uVar1);
        uVar2 = this->_height;
      }
      y = y + tile_height;
    } while (y < uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image> Image::crops(unsigned tile_width, unsigned tile_height, Mode mode) const {
  std::vector<Image> v;
  unsigned x = 0;
  unsigned y = 0;
  while (y < _height) {
    while (x < _width) {
      v.push_back(crop(x, y, tile_width, tile_height, mode));
      x += tile_width;
    }
    x = 0;
    y += tile_height;
  }
  return v;
}